

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O3

UString * __thiscall
jsonnet::internal::Token::data32_abi_cxx11_(UString *__return_storage_ptr__,Token *this)

{
  ulong uVar1;
  pointer pcVar2;
  long lVar3;
  long lVar4;
  char32_t cVar5;
  char32_t __c;
  size_type sVar6;
  ulong uVar7;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  sVar6 = (this->data)._M_string_length;
  if (sVar6 != 0) {
    uVar7 = 0;
    do {
      pcVar2 = (this->data)._M_dataplus._M_p;
      cVar5 = (char32_t)pcVar2[uVar7];
      __c = cVar5;
      if (pcVar2[uVar7] < '\0') {
        if ((cVar5 & 0xe0U) == 0xc0) {
          uVar1 = uVar7 + 1;
          __c = L'�';
          if ((uVar1 < sVar6) &&
             (uVar7 = uVar1, __c = (byte)pcVar2[uVar1] & 0x3f | (cVar5 & 0x1fU) << 6,
             (pcVar2[uVar1] & 0xc0U) != 0x80)) {
            __c = L'�';
          }
        }
        else if ((cVar5 & 0xf0U) == 0xe0) {
          uVar1 = uVar7 + 2;
          __c = L'�';
          if (uVar1 < sVar6) {
            lVar3 = uVar7 + 1;
            if (((int)pcVar2[lVar3] & 0xc0U) == 0x80) {
              uVar7 = uVar1;
              if (((byte)pcVar2[uVar1] & 0xffffffc0) == 0x80) {
                __c = (byte)pcVar2[uVar1] & 0x3f |
                      ((int)pcVar2[lVar3] & 0x3fU) << 6 | (cVar5 & 0xfU) << 0xc;
              }
            }
            else {
LAB_001a592e:
              uVar7 = uVar7 + 1;
              __c = L'�';
            }
          }
        }
        else {
          uVar1 = uVar7 + 3;
          __c = L'�';
          if ((uVar1 < sVar6) && ((cVar5 & 0xf8U) == 0xf0)) {
            lVar3 = uVar7 + 1;
            if (((int)pcVar2[lVar3] & 0xc0U) != 0x80) goto LAB_001a592e;
            lVar4 = uVar7 + 2;
            if (((int)pcVar2[lVar4] & 0xc0U) == 0x80) {
              uVar7 = uVar1;
              if (((byte)pcVar2[uVar1] & 0xffffffc0) == 0x80) {
                __c = (byte)pcVar2[uVar1] & 0x3f |
                      ((int)pcVar2[lVar4] & 0x3fU) << 6 |
                      ((int)pcVar2[lVar3] & 0x3fU) << 0xc | (cVar5 & 7U) << 0x12;
              }
            }
            else {
              uVar7 = uVar7 + 2;
            }
          }
        }
      }
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(__return_storage_ptr__,__c);
      uVar7 = uVar7 + 1;
      sVar6 = (this->data)._M_string_length;
    } while (uVar7 < sVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

UString data32(void) const
    {
        return decode_utf8(data);
    }